

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_edge.cpp
# Opt level: O0

void __thiscall test_edge_order_edge_vertex_Test::TestBody(test_edge_order_edge_vertex_Test *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  char *regex;
  pair<const_unsigned_long_&,_const_unsigned_long_&> pVar5;
  AssertHelper local_1b0;
  Message local_1a8;
  int local_19c;
  exception *gtest_exception;
  unsigned_long *local_168;
  ReturnSentinel local_160;
  ReturnSentinel gtest_sentinel;
  unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  gtest_dt_ptr;
  pointer local_138;
  DeathTest *gtest_dt;
  Message local_128;
  int local_11c;
  pair<const_unsigned_long_&,_const_unsigned_long_&> local_118;
  undefined1 local_108 [8];
  AssertionResult gtest_ar_3;
  Message local_f0;
  int local_e4;
  pair<const_unsigned_long_&,_const_unsigned_long_&> local_e0;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar_2;
  pair<unsigned_long,_unsigned_long> local_b8;
  AssertHelper local_a8;
  Message local_a0;
  int local_94;
  pair<const_unsigned_long_&,_const_unsigned_long_&> local_90;
  undefined1 local_80 [8];
  AssertionResult gtest_ar_1;
  Message local_68 [3];
  int local_4c;
  pair<const_unsigned_long_&,_const_unsigned_long_&> local_48;
  undefined1 local_38 [8];
  AssertionResult gtest_ar;
  undefined1 local_20 [8];
  Edge edge;
  test_edge_order_edge_vertex_Test *this_local;
  
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_4_ = 0;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 1;
  edge.second = (unsigned_long)this;
  std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>
            ((pair<unsigned_long,_unsigned_long> *)local_20,
             (int *)((long)&gtest_ar.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 4),(int *)&gtest_ar.message_);
  local_48 = Disa::order_edge_vertex((pair<unsigned_long,_unsigned_long> *)local_20);
  local_4c = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_38,"order_edge_vertex(&edge).first","0",local_48.first,&local_4c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    testing::Message::Message(local_68);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_38);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_edge.cpp"
               ,0x21,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  local_90 = Disa::order_edge_vertex((Edge *)local_20);
  local_94 = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_80,"order_edge_vertex(&edge).second","1",local_90.second,&local_94);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
  if (!bVar1) {
    testing::Message::Message(&local_a0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_80);
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_edge.cpp"
               ,0x22,pcVar4);
    testing::internal::AssertHelper::operator=(&local_a8,&local_a0);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    testing::Message::~Message(&local_a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
  gtest_ar_2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_4_ = 3;
  gtest_ar_2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 2;
  std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>
            (&local_b8,
             (int *)((long)&gtest_ar_2.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 4),(int *)&gtest_ar_2.message_);
  std::pair<unsigned_long,_unsigned_long>::operator=
            ((pair<unsigned_long,_unsigned_long> *)local_20,&local_b8);
  local_e0 = Disa::order_edge_vertex((pair<unsigned_long,_unsigned_long> *)local_20);
  local_e4 = 2;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_d0,"order_edge_vertex(&edge).first","2",local_e0.first,&local_e4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
  if (!bVar1) {
    testing::Message::Message(&local_f0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_edge.cpp"
               ,0x25,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
  local_118 = Disa::order_edge_vertex((Edge *)local_20);
  local_11c = 3;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_108,"order_edge_vertex(&edge).second","3",local_118.second,&local_11c
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
  if (!bVar1) {
    testing::Message::Message(&local_128);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_108);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_edge.cpp"
               ,0x26,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt,&local_128);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    testing::Message::~Message(&local_128);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
  bVar1 = testing::internal::AlwaysTrue();
  if (!bVar1) goto LAB_0010bdc3;
  testing::internal::MakeDeathTestMatcher_abi_cxx11_
            ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              *)&gtest_dt_ptr,(internal *)".*",regex);
  bVar1 = testing::internal::DeathTest::Create
                    ("order_edge_vertex(nullptr)",
                     (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                      *)&gtest_dt_ptr,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_edge.cpp"
                     ,0x28,&local_138);
  testing::
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>::
  ~Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
            *)&gtest_dt_ptr);
  if (((bVar1 ^ 0xffU) & 1) != 0) goto LAB_0010bdc3;
  if (local_138 == (pointer)0x0) {
    return;
  }
  std::unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>::
  unique_ptr<std::default_delete<testing::internal::DeathTest>,void>
            ((unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>
              *)&gtest_sentinel,local_138);
  iVar2 = (*local_138->_vptr_DeathTest[2])();
  if (iVar2 == 0) {
    iVar2 = (*local_138->_vptr_DeathTest[3])();
    bVar1 = testing::internal::ExitedUnsuccessfully(iVar2);
    uVar3 = (*local_138->_vptr_DeathTest[4])(local_138,(ulong)bVar1);
    if ((uVar3 & 1) != 0) goto LAB_0010bd85;
    local_19c = 2;
  }
  else {
    if (iVar2 == 1) {
      testing::internal::DeathTest::ReturnSentinel::ReturnSentinel(&local_160,local_138);
      bVar1 = testing::internal::AlwaysTrue();
      pVar5.second = local_168;
      pVar5.first = (unsigned_long *)gtest_exception;
      if (bVar1) {
        pVar5 = Disa::order_edge_vertex((Edge *)0x0);
      }
      local_168 = pVar5.second;
      gtest_exception = (exception *)pVar5.first;
      (*local_138->_vptr_DeathTest[5])(local_138,2);
      testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&local_160);
    }
LAB_0010bd85:
    local_19c = 0;
  }
  std::unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  ::~unique_ptr((unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
                 *)&gtest_sentinel);
  if (local_19c == 0) {
    return;
  }
LAB_0010bdc3:
  testing::Message::Message(&local_1a8);
  pcVar4 = testing::internal::DeathTest::LastMessage();
  testing::internal::AssertHelper::AssertHelper
            (&local_1b0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_edge.cpp"
             ,0x28,pcVar4);
  testing::internal::AssertHelper::operator=(&local_1b0,&local_1a8);
  testing::internal::AssertHelper::~AssertHelper(&local_1b0);
  testing::Message::~Message(&local_1a8);
  return;
}

Assistant:

TEST(test_edge, order_edge_vertex) {
  Edge edge({0, 1});
  EXPECT_EQ(order_edge_vertex(&edge).first, 0);
  EXPECT_EQ(order_edge_vertex(&edge).second, 1);

  edge = Edge({3, 2});
  EXPECT_EQ(order_edge_vertex(&edge).first, 2);
  EXPECT_EQ(order_edge_vertex(&edge).second, 3);

  EXPECT_DEATH(order_edge_vertex(nullptr), ".*");
}